

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O3

void __thiscall sf2cute::SFZone::SFZone(SFZone *this,SFZone *origin)

{
  pointer puVar1;
  SFGeneratorItem *pSVar2;
  pointer puVar3;
  SFModulatorItem *pSVar4;
  undefined8 uVar5;
  SFZone *pSVar6;
  pointer puVar7;
  pointer puVar8;
  __uniq_ptr_impl<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_> local_40
  ;
  SFZone *local_38;
  
  this->_vptr_SFZone = (_func_int **)&PTR__SFZone_0011e810;
  (this->generators_).
  super__Vector_base<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->generators_).
  super__Vector_base<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->generators_).
  super__Vector_base<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->modulators_).
  super__Vector_base<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->modulators_).
  super__Vector_base<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->modulators_).
  super__Vector_base<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
  ::reserve(&this->generators_,
            (long)(origin->generators_).
                  super__Vector_base<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(origin->generators_).
                  super__Vector_base<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  puVar8 = (origin->generators_).
           super__Vector_base<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (origin->generators_).
           super__Vector_base<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_38 = origin;
  if (puVar8 != puVar1) {
    do {
      pSVar2 = (puVar8->_M_t).
               super___uniq_ptr_impl<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>
               ._M_t.
               super__Tuple_impl<0UL,_sf2cute::SFGeneratorItem_*,_std::default_delete<sf2cute::SFGeneratorItem>_>
               .super__Head_base<0UL,_sf2cute::SFGeneratorItem_*,_false>._M_head_impl;
      local_40._M_t.
      super__Tuple_impl<0UL,_sf2cute::SFGeneratorItem_*,_std::default_delete<sf2cute::SFGeneratorItem>_>
      .super__Head_base<0UL,_sf2cute::SFGeneratorItem_*,_false>._M_head_impl =
           (tuple<sf2cute::SFGeneratorItem_*,_std::default_delete<sf2cute::SFGeneratorItem>_>)
           operator_new(4);
      *(SFGeneratorItem *)
       local_40._M_t.
       super__Tuple_impl<0UL,_sf2cute::SFGeneratorItem_*,_std::default_delete<sf2cute::SFGeneratorItem>_>
       .super__Head_base<0UL,_sf2cute::SFGeneratorItem_*,_false>._M_head_impl = *pSVar2;
      std::
      vector<std::unique_ptr<sf2cute::SFGeneratorItem,std::default_delete<sf2cute::SFGeneratorItem>>,std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,std::default_delete<sf2cute::SFGeneratorItem>>>>
      ::
      emplace_back<std::unique_ptr<sf2cute::SFGeneratorItem,std::default_delete<sf2cute::SFGeneratorItem>>>
                ((vector<std::unique_ptr<sf2cute::SFGeneratorItem,std::default_delete<sf2cute::SFGeneratorItem>>,std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,std::default_delete<sf2cute::SFGeneratorItem>>>>
                  *)&this->generators_,
                 (unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>
                  *)&local_40);
      if ((_Tuple_impl<0UL,_sf2cute::SFGeneratorItem_*,_std::default_delete<sf2cute::SFGeneratorItem>_>
           )local_40._M_t.
            super__Tuple_impl<0UL,_sf2cute::SFGeneratorItem_*,_std::default_delete<sf2cute::SFGeneratorItem>_>
            .super__Head_base<0UL,_sf2cute::SFGeneratorItem_*,_false>._M_head_impl !=
          (SFGeneratorItem *)0x0) {
        operator_delete((void *)local_40._M_t.
                                super__Tuple_impl<0UL,_sf2cute::SFGeneratorItem_*,_std::default_delete<sf2cute::SFGeneratorItem>_>
                                .super__Head_base<0UL,_sf2cute::SFGeneratorItem_*,_false>.
                                _M_head_impl,4);
      }
      puVar8 = puVar8 + 1;
    } while (puVar8 != puVar1);
  }
  pSVar6 = local_38;
  std::
  vector<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
  ::reserve(&this->modulators_,
            (long)(local_38->modulators_).
                  super__Vector_base<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(local_38->modulators_).
                  super__Vector_base<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  puVar7 = (pSVar6->modulators_).
           super__Vector_base<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (pSVar6->modulators_).
           super__Vector_base<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar7 != puVar3) {
    do {
      pSVar4 = (puVar7->_M_t).
               super___uniq_ptr_impl<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>
               ._M_t.
               super__Tuple_impl<0UL,_sf2cute::SFModulatorItem_*,_std::default_delete<sf2cute::SFModulatorItem>_>
               .super__Head_base<0UL,_sf2cute::SFModulatorItem_*,_false>._M_head_impl;
      local_40._M_t.
      super__Tuple_impl<0UL,_sf2cute::SFGeneratorItem_*,_std::default_delete<sf2cute::SFGeneratorItem>_>
      .super__Head_base<0UL,_sf2cute::SFGeneratorItem_*,_false>._M_head_impl =
           (tuple<sf2cute::SFGeneratorItem_*,_std::default_delete<sf2cute::SFGeneratorItem>_>)
           operator_new(0x12);
      ((SFGeneratorItem *)
      ((long)local_40._M_t.
             super__Tuple_impl<0UL,_sf2cute::SFGeneratorItem_*,_std::default_delete<sf2cute::SFGeneratorItem>_>
             .super__Head_base<0UL,_sf2cute::SFGeneratorItem_*,_false>._M_head_impl + 0x10))->op_ =
           *(SFGenerator *)&pSVar4->transform_op_;
      uVar5 = *(undefined8 *)&(pSVar4->key_).amount_source_op_;
      *(undefined8 *)
       local_40._M_t.
       super__Tuple_impl<0UL,_sf2cute::SFGeneratorItem_*,_std::default_delete<sf2cute::SFGeneratorItem>_>
       .super__Head_base<0UL,_sf2cute::SFGeneratorItem_*,_false>._M_head_impl =
           *(undefined8 *)&pSVar4->key_;
      *(undefined8 *)
       ((long)local_40._M_t.
              super__Tuple_impl<0UL,_sf2cute::SFGeneratorItem_*,_std::default_delete<sf2cute::SFGeneratorItem>_>
              .super__Head_base<0UL,_sf2cute::SFGeneratorItem_*,_false>._M_head_impl + 8) = uVar5;
      std::
      vector<std::unique_ptr<sf2cute::SFModulatorItem,std::default_delete<sf2cute::SFModulatorItem>>,std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,std::default_delete<sf2cute::SFModulatorItem>>>>
      ::
      emplace_back<std::unique_ptr<sf2cute::SFModulatorItem,std::default_delete<sf2cute::SFModulatorItem>>>
                ((vector<std::unique_ptr<sf2cute::SFModulatorItem,std::default_delete<sf2cute::SFModulatorItem>>,std::allocator<std::unique_ptr<sf2cute::SFModulatorItem,std::default_delete<sf2cute::SFModulatorItem>>>>
                  *)&this->modulators_,
                 (unique_ptr<sf2cute::SFModulatorItem,_std::default_delete<sf2cute::SFModulatorItem>_>
                  *)&local_40);
      if (local_40._M_t.
          super__Tuple_impl<0UL,_sf2cute::SFGeneratorItem_*,_std::default_delete<sf2cute::SFGeneratorItem>_>
          .super__Head_base<0UL,_sf2cute::SFGeneratorItem_*,_false>._M_head_impl !=
          (_Tuple_impl<0UL,_sf2cute::SFGeneratorItem_*,_std::default_delete<sf2cute::SFGeneratorItem>_>
           )0x0) {
        operator_delete((void *)local_40._M_t.
                                super__Tuple_impl<0UL,_sf2cute::SFGeneratorItem_*,_std::default_delete<sf2cute::SFGeneratorItem>_>
                                .super__Head_base<0UL,_sf2cute::SFGeneratorItem_*,_false>.
                                _M_head_impl,0x12);
      }
      puVar7 = puVar7 + 1;
    } while (puVar7 != puVar3);
  }
  return;
}

Assistant:

SFZone::SFZone(const SFZone & origin) {
  // Copy generators.
  generators_.reserve(origin.generators().size());
  for (const auto & generator : origin.generators()) {
    generators_.push_back(std::make_unique<SFGeneratorItem>(*generator));
  }

  // Copy modulators.
  modulators_.reserve(origin.modulators().size());
  for (const auto & modulator : origin.modulators()) {
    modulators_.push_back(std::make_unique<SFModulatorItem>(*modulator));
  }
}